

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3RunnerNonRecursive.hpp
# Opt level: O0

semantic_value_type __thiscall Centaurus::Stage3Runner::reduce(Stage3Runner *this)

{
  tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  *__t;
  tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  *__t_00;
  bool bVar1;
  undefined8 *puVar2;
  __tuple_element_t<0UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *this_00;
  __tuple_element_t<1UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *this_01;
  __tuple_element_t<2UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *this_02;
  __tuple_element_t<3UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *this_03;
  __tuple_element_t<0UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *this_04;
  __tuple_element_t<1UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *this_05;
  __tuple_element_t<2UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *this_06;
  __tuple_element_t<3UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *this_07;
  reference pSVar3;
  reference pCVar4;
  size_type sVar5;
  reference pvVar6;
  value_type local_f8;
  type_conflict result;
  __normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
  local_c8;
  __normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
  local_c0;
  __normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
  local_b8;
  __normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
  local_b0;
  StackEntryTag local_a4;
  iterator iStack_a0;
  StackEntryTag cur_tag;
  iterator __end3;
  iterator __begin3;
  __tuple_element_t<3UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *__range3;
  iterator values_next_it;
  iterator ends_next_it;
  iterator starts_next_it;
  __tuple_element_t<3UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *tags_next;
  __tuple_element_t<2UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *values_next;
  __tuple_element_t<1UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *ends_next;
  __tuple_element_t<0UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *starts_next;
  type *stack_tuple;
  void *current_bank;
  __tuple_element_t<3UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *tags;
  __tuple_element_t<2UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *values;
  __tuple_element_t<1UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *ends;
  __tuple_element_t<0UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
  *starts;
  tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  *stack_tuple_base;
  tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
  **bank_base_ptr;
  Stage3Runner *this_local;
  
  puVar2 = (undefined8 *)acquire_bank(this);
  if (puVar2 == (undefined8 *)0x0) {
    __assert_fail("bank_base_ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                  ,0x34,"semantic_value_type Centaurus::Stage3Runner::reduce()");
  }
  __t = (tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
         *)*puVar2;
  this_00 = std::
            get<0ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                      (__t);
  this_01 = std::
            get<1ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                      (__t);
  this_02 = std::
            get<2ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                      (__t);
  this_03 = std::
            get<3ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                      (__t);
  release_bank(this);
  while( true ) {
    puVar2 = (undefined8 *)acquire_bank(this);
    if (puVar2 == (undefined8 *)0x0) {
      bVar1 = std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::empty
                        (this_00);
      if (!bVar1) {
        __assert_fail("starts.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                      ,0x6b,"semantic_value_type Centaurus::Stage3Runner::reduce()");
      }
      bVar1 = std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::empty
                        (this_01);
      if (!bVar1) {
        __assert_fail("ends.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                      ,0x6c,"semantic_value_type Centaurus::Stage3Runner::reduce()");
      }
      sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_02);
      if (1 < sVar5) {
        __assert_fail("values.size() <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                      ,0x6d,"semantic_value_type Centaurus::Stage3Runner::reduce()");
      }
      sVar5 = std::
              vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
              ::size(this_03);
      if (sVar5 < 2) {
        bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(this_02);
        if (bVar1) {
          local_f8 = 0;
        }
        else {
          pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front(this_02);
          local_f8 = *pvVar6;
        }
        if (__t != (tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                    *)0x0) {
          std::
          tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
          ::~tuple(__t);
          operator_delete(__t);
        }
        return local_f8;
      }
      __assert_fail("tags.size() <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                    ,0x6e,"semantic_value_type Centaurus::Stage3Runner::reduce()");
    }
    __t_00 = (tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
              *)*puVar2;
    this_04 = std::
              get<0ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                        (__t_00);
    this_05 = std::
              get<1ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                        (__t_00);
    this_06 = std::
              get<2ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                        (__t_00);
    this_07 = std::
              get<3ul,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<Centaurus::CSTMarker,std::allocator<Centaurus::CSTMarker>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<Centaurus::detail::StackEntryTag,std::allocator<Centaurus::detail::StackEntryTag>>>
                        (__t_00);
    ends_next_it = std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::begin
                             (this_04);
    values_next_it._M_current =
         (unsigned_long *)
         std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::begin(this_05);
    __range3 = (__tuple_element_t<3UL,_tuple<vector<CSTMarker,_allocator<CSTMarker>_>,_vector<CSTMarker,_allocator<CSTMarker>_>,_vector<unsigned_long,_allocator<unsigned_long>_>,_vector<StackEntryTag,_allocator<StackEntryTag>_>_>_>
                *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_06);
    __end3 = std::
             vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             ::begin(this_07);
    iStack_a0 = std::
                vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                ::end(this_07);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff60);
      if (!bVar1) break;
      pSVar3 = __gnu_cxx::
               __normal_iterator<Centaurus::detail::StackEntryTag_*,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
               ::operator*(&__end3);
      local_a4 = *pSVar3;
      if (local_a4 == START_MARKER) {
        local_b0 = __gnu_cxx::
                   __normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
                   ::operator++(&ends_next_it,0);
        pCVar4 = __gnu_cxx::
                 __normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
                 ::operator*(&local_b0);
        NonRecursiveReductionRunner::push_start_marker(pCVar4,this_00,this_03);
      }
      else if (local_a4 == END_MARKER) {
        bVar1 = std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::empty
                          (this_00);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!starts.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                        ,0x58,"semantic_value_type Centaurus::Stage3Runner::reduce()");
        }
        local_b8 = __gnu_cxx::
                   __normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
                   ::operator++((__normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
                                 *)&values_next_it,0);
        pCVar4 = __gnu_cxx::
                 __normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
                 ::operator*(&local_b8);
        NonRecursiveReductionRunner::reduce_by_end_marker
                  (&this->super_NonRecursiveReductionRunner,pCVar4,this_00,this_02,this_03);
      }
      else {
        bVar1 = detail::isValueTag(local_a4);
        if (!bVar1) {
          __assert_fail("detail::isValueTag(cur_tag)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                        ,0x5c,"semantic_value_type Centaurus::Stage3Runner::reduce()");
        }
        append_value<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&__range3,local_a4,this_02,this_03);
      }
      __gnu_cxx::
      __normal_iterator<Centaurus::detail::StackEntryTag_*,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
      ::operator++(&__end3);
    }
    local_c0._M_current =
         (CSTMarker *)
         std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::end(this_04);
    bVar1 = __gnu_cxx::operator==(&ends_next_it,&local_c0);
    if (!bVar1) {
      __assert_fail("starts_next_it == starts_next.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                    ,0x61,"semantic_value_type Centaurus::Stage3Runner::reduce()");
    }
    local_c8._M_current =
         (CSTMarker *)
         std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::end(this_05);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<Centaurus::CSTMarker_*,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>_>
                        *)&values_next_it,&local_c8);
    if (!bVar1) {
      __assert_fail("ends_next_it == ends_next.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                    ,0x62,"semantic_value_type Centaurus::Stage3Runner::reduce()");
    }
    result = (type_conflict)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_06)
    ;
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&__range3,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&result);
    if (!bVar1) break;
    if (__t_00 != (tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
                   *)0x0) {
      std::
      tuple<std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>_>
      ::~tuple(__t_00);
      operator_delete(__t_00);
    }
    release_bank(this);
  }
  __assert_fail("values_next_it == values_next.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage3RunnerNonRecursive.hpp"
                ,100,"semantic_value_type Centaurus::Stage3Runner::reduce()");
}

Assistant:

semantic_value_type reduce()
  {
#if PYCENTAURUS
    auto bank_ptr = reinterpret_cast<uint64_t*>(acquire_bank());
    assert(bank_ptr != nullptr);
    std::vector<CSTMarker> starts(*bank_ptr++, CSTMarker(0));
    std::memcpy(starts.data(), bank_ptr, starts.size()*sizeof(CSTMarker));
    bank_ptr += starts.size();
    std::vector<CSTMarker> ends(*bank_ptr++, CSTMarker(0));
    assert(ends.empty());
    std::vector<semantic_value_type> values(*bank_ptr++);
    std::memcpy(values.data(), bank_ptr, values.size()*sizeof(semantic_value_type));
    assert(values[0] == 0 && values.size() == 1);
    bank_ptr += values.size();
    std::vector<detail::StackEntryTag> tags(*bank_ptr++);
    std::memcpy(tags.data(), bank_ptr, tags.size()*sizeof(detail::StackEntryTag));
#else
    auto bank_base_ptr = reinterpret_cast<std::tuple<std::vector<CSTMarker>,
                                                     std::vector<CSTMarker>,
                                                     std::vector<semantic_value_type>,
                                                     std::vector<detail::StackEntryTag>>**>(acquire_bank());
    assert(bank_base_ptr != nullptr);
    auto& stack_tuple_base = **bank_base_ptr;
    auto& starts = std::get<0>(stack_tuple_base);
    auto& ends   = std::get<1>(stack_tuple_base);
    auto& values = std::get<2>(stack_tuple_base);
    auto& tags   = std::get<3>(stack_tuple_base);
#endif
    release_bank();

    void *current_bank;
    while ((current_bank = acquire_bank()) != nullptr) {
#if PYCENTAURUS
      auto bank_ptr = reinterpret_cast<uint64_t*>(current_bank);
      detail::ConstPtrRange<CSTMarker> starts_next(reinterpret_cast<CSTMarker*>(bank_ptr + 1), bank_ptr[0]);
      bank_ptr += starts_next.size() + 1;
      detail::ConstPtrRange<CSTMarker> ends_next(reinterpret_cast<CSTMarker*>(bank_ptr + 1), bank_ptr[0]);
      bank_ptr += ends_next.size() + 1;
      detail::ConstPtrRange<semantic_value_type> values_next(bank_ptr + 1, bank_ptr[0]);
      bank_ptr += values_next.size() + 1;
      detail::ConstPtrRange<detail::StackEntryTag> tags_next(reinterpret_cast<detail::StackEntryTag*>(bank_ptr + 1), bank_ptr[0]);
#else
      auto& stack_tuple = **reinterpret_cast<std::decay<decltype(stack_tuple_base)>::type**>(current_bank);
      auto& starts_next = std::get<0>(stack_tuple);
      auto& ends_next   = std::get<1>(stack_tuple);
      auto& values_next = std::get<2>(stack_tuple);
      auto& tags_next   = std::get<3>(stack_tuple);
#endif
      auto starts_next_it = starts_next.begin();
      auto ends_next_it   = ends_next.begin();
      auto values_next_it = values_next.begin();
      for (auto cur_tag : tags_next) {
        switch (cur_tag) {
        case detail::StackEntryTag::START_MARKER:
          push_start_marker(*starts_next_it++, starts, tags);
          break;
        case detail::StackEntryTag::END_MARKER: {
          assert(!starts.empty());
          reduce_by_end_marker(*ends_next_it++, starts, values, tags);
        } break;
        default:
          assert(detail::isValueTag(cur_tag));
          append_value(values_next_it, static_cast<int>(cur_tag), values, tags);
          break;
        }
      }
      assert(starts_next_it == starts_next.end());
      assert(ends_next_it == ends_next.end());
#if !PYCENTAURUS
      assert(values_next_it == values_next.end());
#endif
#if !PYCENTAURUS
      delete &stack_tuple;
#endif
      release_bank();
    }
    assert(starts.empty());
    assert(ends.empty());
    assert(values.size() <= 1);
    assert(tags.size() <= 1);

    auto result = (values.empty()) ? 0 : std::move(values.front());
#if !PYCENTAURUS
    delete &stack_tuple_base;
#endif
    return result;
  }